

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O2

void __thiscall
axl::sl::ConstructSingleton<axl::sl::StringHashTable<void_(*)()>_>::operator()
          (ConstructSingleton<axl::sl::StringHashTable<void_(*)()>_> *this,void *p)

{
  Module *this_00;
  DestructSingleton<axl::sl::StringHashTable<void_(*)()>_> *p_00;
  Ptr<axl::g::Finalizer> local_20;
  
  *(undefined8 *)((long)p + 0x20) = 0;
  *(undefined8 *)((long)p + 0x28) = 0;
  *(undefined8 *)((long)p + 0x10) = 0;
  *(undefined8 *)((long)p + 0x18) = 0;
  *(undefined8 *)p = 0;
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined8 *)((long)p + 0x30) = 0x4b;
  this_00 = g::getModule();
  p_00 = (DestructSingleton<axl::sl::StringHashTable<void_(*)()>_> *)mem::allocate(0x28);
  (p_00->super_RefCount).m_refCount = 0;
  (p_00->super_RefCount).m_weakRefCount = 1;
  (p_00->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_0014a060;
  (p_00->super_Finalizer)._vptr_Finalizer = (_func_int **)&DAT_0014a088;
  p_00->m_p = (StringHashTable<void_(*)()> *)p;
  (p_00->super_RefCount).m_freeFunc = mem::deallocate;
  rc::Ptr<axl::g::Finalizer>::Ptr<axl::sl::DestructSingleton<axl::sl::StringHashTable<void(*)()>>>
            (&local_20,p_00);
  g::Module::addFinalizer(this_00,&local_20);
  rc::Ptr<axl::g::Finalizer>::~Ptr(&local_20);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}